

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void dwpt_per(wpt_object wt,double *inp,int N,double *cA,int len_cA,double *cD)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int len_avg;
  int t;
  int i;
  int isodd;
  int l2;
  int l;
  double *cD_local;
  int len_cA_local;
  double *cA_local;
  int N_local;
  double *inp_local;
  wpt_object wt_local;
  
  iVar1 = wt->wave->lpd_len;
  iVar2 = iVar1 / 2;
  iVar4 = N % 2;
  for (len_avg = 0; len_avg < len_cA; len_avg = len_avg + 1) {
    iVar3 = len_avg * 2 + iVar2;
    cA[len_avg] = 0.0;
    cD[len_avg] = 0.0;
    for (isodd = 0; isodd < iVar1; isodd = isodd + 1) {
      if ((iVar3 - isodd < iVar2) || (N <= iVar3 - isodd)) {
        if ((iVar3 - isodd < iVar2) && (-1 < iVar3 - isodd)) {
          cA[len_avg] = wt->wave->lpd[isodd] * inp[iVar3 - isodd] + cA[len_avg];
          cD[len_avg] = wt->wave->hpd[isodd] * inp[iVar3 - isodd] + cD[len_avg];
        }
        else if ((iVar3 - isodd < 0) && (iVar4 == 0)) {
          cA[len_avg] = wt->wave->lpd[isodd] * inp[(iVar3 - isodd) + N] + cA[len_avg];
          cD[len_avg] = wt->wave->hpd[isodd] * inp[(iVar3 - isodd) + N] + cD[len_avg];
        }
        else if ((iVar3 - isodd < 0) && (iVar4 == 1)) {
          if (iVar3 - isodd == -1) {
            cA[len_avg] = wt->wave->lpd[isodd] * inp[N + -1] + cA[len_avg];
            cD[len_avg] = wt->wave->hpd[isodd] * inp[N + -1] + cD[len_avg];
          }
          else {
            cA[len_avg] = wt->wave->lpd[isodd] * inp[(iVar3 - isodd) + N + 1] + cA[len_avg];
            cD[len_avg] = wt->wave->hpd[isodd] * inp[(iVar3 - isodd) + N + 1] + cD[len_avg];
          }
        }
        else if ((iVar3 - isodd < N) || (iVar4 != 0)) {
          if ((N <= iVar3 - isodd) && (iVar4 == 1)) {
            if (iVar3 - isodd == N) {
              cA[len_avg] = wt->wave->lpd[isodd] * inp[N + -1] + cA[len_avg];
              cD[len_avg] = wt->wave->hpd[isodd] * inp[N + -1] + cD[len_avg];
            }
            else {
              cA[len_avg] = wt->wave->lpd[isodd] * inp[(iVar3 - isodd) - (N + 1)] + cA[len_avg];
              cD[len_avg] = wt->wave->hpd[isodd] * inp[(iVar3 - isodd) - (N + 1)] + cD[len_avg];
            }
          }
        }
        else {
          cA[len_avg] = wt->wave->lpd[isodd] * inp[(iVar3 - isodd) - N] + cA[len_avg];
          cD[len_avg] = wt->wave->hpd[isodd] * inp[(iVar3 - isodd) - N] + cD[len_avg];
        }
      }
      else {
        cA[len_avg] = wt->wave->lpd[isodd] * inp[iVar3 - isodd] + cA[len_avg];
        cD[len_avg] = wt->wave->hpd[isodd] * inp[iVar3 - isodd] + cD[len_avg];
      }
    }
  }
  return;
}

Assistant:

static void dwpt_per(wpt_object wt, double *inp, int N, double *cA, int len_cA, double *cD) {
	int l, l2, isodd, i, t, len_avg;

	len_avg = wt->wave->lpd_len;
	l2 = len_avg / 2;
	isodd = N % 2;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + l2;
		cA[i] = 0.0;
		cD[i] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= l2 && (t - l) < N) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < l2 && (t - l) >= 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < 0 && isodd == 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l + N];
				cD[i] += wt->wave->hpd[l] * inp[t - l + N];
			}
			else if ((t - l) < 0 && isodd == 1) {
				if ((t - l) != -1) {
					cA[i] += wt->wave->lpd[l] * inp[t - l + N + 1];
					cD[i] += wt->wave->hpd[l] * inp[t - l + N + 1];
				}
				else {
					cA[i] += wt->wave->lpd[l] * inp[N - 1];
					cD[i] += wt->wave->hpd[l] * inp[N - 1];
				}
			}
			else if ((t - l) >= N && isodd == 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l - N];
				cD[i] += wt->wave->hpd[l] * inp[t - l - N];
			}
			else if ((t - l) >= N && isodd == 1) {
				if (t - l != N) {
					cA[i] += wt->wave->lpd[l] * inp[t - l - (N + 1)];
					cD[i] += wt->wave->hpd[l] * inp[t - l - (N + 1)];
				}
				else {
					cA[i] += wt->wave->lpd[l] * inp[N - 1];
					cD[i] += wt->wave->hpd[l] * inp[N - 1];
				}
			}

		}
	}



}